

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

IString __thiscall wasm::Wasm2JSBuilder::getTemp(Wasm2JSBuilder *this,Type type,Function *func)

{
  pointer pvVar1;
  pointer pIVar2;
  pointer puVar3;
  ulong uVar4;
  char cVar5;
  bool bVar6;
  undefined8 *puVar7;
  long *plVar8;
  IString *this_00;
  __node_base_ptr p_Var9;
  ulong *puVar10;
  ulong uVar11;
  long *plVar12;
  char cVar13;
  undefined8 uVar14;
  char *pcVar15;
  Type in_R8;
  __hash_code __code;
  string_view sVar16;
  Name name;
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  string local_d8;
  ulong *local_b8;
  uintptr_t local_b0;
  ulong local_a8;
  long lStack_a0;
  long *local_98;
  undefined8 local_90;
  long local_88;
  undefined8 uStack_80;
  string_view local_78;
  long local_68;
  undefined8 uStack_60;
  Type local_58;
  Type type_local;
  string __str;
  
  local_58.id = type.id;
  bVar6 = wasm::Type::isTuple(&local_58);
  if (bVar6) {
    pcVar15 = "!type.isTuple() && \"Unexpected tuple type\"";
LAB_005dc71e:
    __assert_fail(pcVar15,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                  ,0xce,"IString wasm::Wasm2JSBuilder::getTemp(Type, Function *)");
  }
  if ((char *)0x6 < local_58.id) {
    pcVar15 = "type.isBasic() && \"TODO: handle compound types\"";
    goto LAB_005dc71e;
  }
  pvVar1 = (this->frees).
           super__Vector_base<std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::allocator<std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = *(pointer *)
            ((long)&pvVar1[local_58.id].
                    super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>._M_impl.
                    super__Vector_impl_data + 8);
  if (pIVar2 != pvVar1[local_58.id].
                super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>._M_impl.
                super__Vector_impl_data._M_start) {
    sVar16 = pIVar2[-1].str;
    *(pointer *)
     ((long)&pvVar1[local_58.id].super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>.
             _M_impl.super__Vector_impl_data + 8) = pIVar2 + -1;
    goto LAB_005dc6ad;
  }
  puVar3 = (this->temps).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = puVar3[local_58.id];
  puVar3[local_58.id] = uVar4 + 1;
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"wasm2js_","");
  wasm::Type::toString_abi_cxx11_(&local_d8,&local_58);
  uVar11 = 0xf;
  if (local_f8 != local_e8) {
    uVar11 = local_e8[0];
  }
  if (uVar11 < local_d8._M_string_length + local_f0) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      uVar14 = local_d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_d8._M_string_length + local_f0) goto LAB_005dc3f6;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_f8);
  }
  else {
LAB_005dc3f6:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_d8._M_dataplus._M_p);
  }
  local_98 = &local_88;
  plVar8 = puVar7 + 2;
  if ((long *)*puVar7 == plVar8) {
    local_88 = *plVar8;
    uStack_80 = puVar7[3];
  }
  else {
    local_88 = *plVar8;
    local_98 = (long *)*puVar7;
  }
  local_90 = puVar7[1];
  *puVar7 = plVar8;
  puVar7[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_98);
  puVar10 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar10) {
    local_a8 = *puVar10;
    lStack_a0 = plVar8[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *puVar10;
    local_b8 = (ulong *)*plVar8;
  }
  local_b0 = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  cVar13 = '\x01';
  if (9 < uVar4) {
    uVar11 = uVar4;
    cVar5 = '\x04';
    do {
      cVar13 = cVar5;
      if (uVar11 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_005dc524;
      }
      if (uVar11 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_005dc524;
      }
      if (uVar11 < 10000) goto LAB_005dc524;
      bVar6 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar5 = cVar13 + '\x04';
    } while (bVar6);
    cVar13 = cVar13 + '\x01';
  }
LAB_005dc524:
  type_local.id = (uintptr_t)&__str._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&type_local,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)type_local.id,(uint)__str._M_dataplus._M_p,uVar4);
  uVar4 = CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p) + local_b0;
  uVar11 = 0xf;
  if (local_b8 != &local_a8) {
    uVar11 = local_a8;
  }
  in_R8.id = local_b0;
  if (uVar11 < uVar4) {
    uVar11 = 0xf;
    if ((size_type *)type_local.id != &__str._M_string_length) {
      uVar11 = __str._M_string_length;
    }
    if (uVar11 < uVar4) goto LAB_005dc58c;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&type_local,0,(char *)0x0,(ulong)local_b8);
  }
  else {
LAB_005dc58c:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,type_local.id);
  }
  plVar8 = &local_68;
  plVar12 = puVar7 + 2;
  if ((long *)*puVar7 == plVar12) {
    local_68 = *plVar12;
    uStack_60 = puVar7[3];
  }
  else {
    local_68 = *plVar12;
    plVar8 = (long *)*puVar7;
  }
  local_78._M_str = (char *)puVar7[1];
  local_78._M_len = (size_t)plVar8;
  *puVar7 = plVar12;
  puVar7[1] = 0;
  *(char *)plVar12 = '\0';
  this_00 = (IString *)strlen((char *)plVar8);
  sVar16._M_str = (char *)0x0;
  sVar16._M_len = (size_t)plVar8;
  sVar16 = IString::interned(this_00,sVar16,SUB81(plVar12,0));
  if ((long *)local_78._M_len != &local_68) {
    operator_delete((void *)local_78._M_len,local_68 + 1);
  }
  if ((size_type *)type_local.id != &__str._M_string_length) {
    operator_delete((void *)type_local.id,__str._M_string_length + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,local_e8[0] + 1);
  }
LAB_005dc6ad:
  pcVar15 = sVar16._M_str;
  local_78 = sVar16;
  p_Var9 = std::
           _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(func->localIndices)._M_h,
                      (ulong)pcVar15 % (func->localIndices)._M_h._M_bucket_count,
                      (key_type *)&local_78,(__hash_code)pcVar15);
  if ((p_Var9 == (__node_base_ptr)0x0) || (p_Var9->_M_nxt == (_Hash_node_base *)0x0)) {
    name.super_IString.str._M_str = (char *)local_58.id;
    name.super_IString.str._M_len = (size_t)pcVar15;
    Builder::addVar((Builder *)func,(Function *)sVar16._M_len,name,in_R8);
  }
  return (IString)sVar16;
}

Assistant:

IString getTemp(Type type, Function* func) {
    IString ret;
    TODO_SINGLE_COMPOUND(type);
    if (frees[type.getBasic()].size() > 0) {
      ret = frees[type.getBasic()].back();
      frees[type.getBasic()].pop_back();
    } else {
      size_t index = temps[type.getBasic()]++;
      ret = IString((std::string("wasm2js_") + type.toString() + "$" +
                     std::to_string(index))
                      .c_str(),
                    false);
    }
    if (func->localIndices.find(ret) == func->localIndices.end()) {
      Builder::addVar(func, ret, type);
    }
    return ret;
  }